

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ParamUtils::localizeCallsTo::LocalizerPass::create(LocalizerPass *this)

{
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *callTargets;
  _func_int **this_00;
  long in_RSI;
  _Any_data local_48;
  code *local_38;
  
  callTargets = *(unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  **)(in_RSI + 0x130);
  this_00 = (_func_int **)operator_new(0x160);
  std::function<void_(wasm::Function_*)>::function
            ((function<void_(wasm::Function_*)> *)&local_48,
             (function<void_(wasm::Function_*)> *)(in_RSI + 0x138));
  localizeCallsTo(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std
  ::allocator<wasm::Name>>const&,wasm::Module&,wasm::PassRunner*,std::function<void(wasm::
  Function*)>)::LocalizerPass::LocalizerPass(std::unordered_set<wasm::Name,std::hash<wasm::Name>,std
  ::equal_to<wasm::Name>,std::allocator<wasm::Name>>const&,std::function<void(wasm::Function__>_
            (this_00,callTargets,(function<void_(wasm::Function_*)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  (this->super_WalkerPass<wasm::PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>_>).
  super_Pass._vptr_Pass = this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
      return std::make_unique<LocalizerPass>(callTargets, onChange);
    }